

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O0

int Abc_NtkCheckRecursive(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *p;
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pObj_00;
  char *pcVar2;
  int local_3c;
  int local_38;
  int RetValue;
  int k;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pModel;
  Vec_Ptr_t *vMods;
  Abc_Ntk_t *pNtk_local;
  
  local_3c = 0;
  iVar1 = Abc_NtkIsNetlist(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                  ,0x279,"int Abc_NtkCheckRecursive(Abc_Ntk_t *)");
  }
  iVar1 = Abc_NtkLatchNum(pNtk);
  if (iVar1 != 0) {
    __assert_fail("!Abc_NtkLatchNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieCec.c"
                  ,0x27a,"int Abc_NtkCheckRecursive(Abc_Ntk_t *)");
  }
  if (pNtk->pDesign == (Abc_Des_t *)0x0) {
    pNtk_local._4_4_ = 0;
  }
  else {
    p = pNtk->pDesign->vModules;
    for (RetValue = 0; iVar1 = Vec_PtrSize(p), RetValue < iVar1; RetValue = RetValue + 1) {
      pNtk_00 = (Abc_Ntk_t *)Vec_PtrEntry(p,RetValue);
      for (local_38 = 0; iVar1 = Vec_PtrSize(pNtk_00->vObjs), local_38 < iVar1;
          local_38 = local_38 + 1) {
        pObj_00 = Abc_NtkObj(pNtk_00,local_38);
        if (((pObj_00 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsBox(pObj_00), iVar1 != 0)) &&
           ((Abc_Ntk_t *)(pObj_00->field_5).pData == pNtk_00)) {
          pcVar2 = Abc_NtkName(pNtk_00);
          printf("WARNING: Model \"%s\" contains a recursive definition.\n",pcVar2);
          local_3c = 1;
          break;
        }
      }
    }
    pNtk_local._4_4_ = local_3c;
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkCheckRecursive( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vMods;
    Abc_Ntk_t * pModel;
    Abc_Obj_t * pObj;
    int i, k, RetValue = 0;

    assert( Abc_NtkIsNetlist(pNtk) );
    assert( !Abc_NtkLatchNum(pNtk) );

    if ( pNtk->pDesign == NULL )
        return RetValue;

    vMods = pNtk->pDesign->vModules;
    Vec_PtrForEachEntry( Abc_Ntk_t *, vMods, pModel, i )
    {
        Abc_NtkForEachObj( pModel, pObj, k )
            if ( Abc_ObjIsBox(pObj) && pObj->pData == (void *)pModel )
            {
                printf( "WARNING: Model \"%s\" contains a recursive definition.\n", Abc_NtkName(pModel) );
                RetValue = 1;
                break;
            }
    }
    return RetValue;
}